

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::LambdaExpression::ToString_abi_cxx11_(string *__return_storage_ptr__,LambdaExpression *this)

{
  pointer pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->lhs);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_38,pPVar1);
  ::std::operator+(&local_98,"(",&local_38);
  ::std::operator+(&local_78,&local_98," -> ");
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->expr);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&bStack_b8,pPVar1);
  ::std::operator+(&local_58,&local_78,&bStack_b8);
  ::std::operator+(__return_storage_ptr__,&local_58,")");
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_b8);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string LambdaExpression::ToString() const {
	return "(" + lhs->ToString() + " -> " + expr->ToString() + ")";
}